

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O0

void __thiscall FMultiPatchTexture::~FMultiPatchTexture(FMultiPatchTexture *this)

{
  FRemapTable *this_00;
  int local_14;
  int i;
  FMultiPatchTexture *this_local;
  
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FMultiPatchTexture_00b87dc0;
  (*(this->super_FTexture)._vptr_FTexture[9])();
  if (this->Parts != (TexPart *)0x0) {
    for (local_14 = 0; local_14 < this->NumParts; local_14 = local_14 + 1) {
      if ((this->Parts[local_14].Translation != (FRemapTable *)0x0) &&
         (this_00 = this->Parts[local_14].Translation, this_00 != (FRemapTable *)0x0)) {
        FRemapTable::~FRemapTable(this_00);
        operator_delete(this_00,0x20);
      }
    }
    if (this->Parts != (TexPart *)0x0) {
      operator_delete__(this->Parts);
    }
    this->Parts = (TexPart *)0x0;
  }
  if (this->Spans != (Span **)0x0) {
    FTexture::FreeSpans(&this->super_FTexture,this->Spans);
    this->Spans = (Span **)0x0;
  }
  FTexture::~FTexture(&this->super_FTexture);
  return;
}

Assistant:

FMultiPatchTexture::~FMultiPatchTexture ()
{
	Unload ();
	if (Parts != NULL)
	{
		for(int i=0; i<NumParts;i++)
		{
			if (Parts[i].Translation != NULL) delete Parts[i].Translation;
		}
		delete[] Parts;
		Parts = NULL;
	}
	if (Spans != NULL)
	{
		FreeSpans (Spans);
		Spans = NULL;
	}
}